

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rvm.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  size_t *psVar1;
  char *pcVar2;
  int *piVar3;
  char cVar4;
  long lVar5;
  long lVar6;
  undefined4 *puVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  void *pvVar11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  Extractor ex;
  Mat r1i;
  float norm_vals2 [3];
  float mean_vals2 [3];
  float norm_vals1 [3];
  float mean_vals1 [3];
  Mat r2i;
  Mat cv_fgr;
  undefined8 local_460;
  long *local_420;
  Mat cv_pha;
  long local_3f8 [7];
  long *local_3c0;
  Net net;
  Mat r3i;
  Mat fgr_;
  Mat r4i;
  Mat m;
  int local_250;
  int local_24c;
  uchar *local_248;
  Mat pha_;
  Mat ncnn_in1;
  Mat ncnn_in2;
  Mat pha;
  undefined8 *local_b0;
  Mat fgr;
  
  if (argc == 2) {
    pcVar2 = argv[1];
    std::__cxx11::string::string((string *)&cv_pha,pcVar2,(allocator *)&cv_fgr);
    cv::imread((string *)&m,(int)&cv_pha);
    if (_cv_pha != local_3f8) {
      operator_delete(_cv_pha);
    }
    cVar4 = cv::Mat::empty();
    if (cVar4 == '\0') {
      cv::Mat::Mat(&fgr);
      cv::Mat::Mat(&pha);
      ncnn::Net::Net(&net);
      net.opt.use_vulkan_compute = false;
      ncnn::Net::load_param(&net,"rvm_512.param");
      ncnn::Net::load_model(&net,"rvm_512.bin");
      r1i.cstep = 0;
      r1i.data._0_4_ = 0;
      r1i.data._4_4_ = 0;
      r1i.refcount._0_4_ = 0;
      r1i.refcount._4_4_ = 0;
      r1i.elemsize._0_4_ = 0;
      r1i.elemsize._4_4_ = 0;
      r1i.elempack = 0;
      r1i.allocator = (Allocator *)0x0;
      r1i.dims = 0;
      r1i.w = 0;
      r1i.h = 0;
      r1i.d = 0;
      r1i.c = 0;
      ncnn::Mat::create(&r1i,0x80,0x80,0x10,4,(Allocator *)0x0);
      r2i.cstep = 0;
      r2i.data._0_4_ = 0;
      r2i.data._4_4_ = 0;
      r2i.refcount._0_4_ = 0;
      r2i.refcount._4_4_ = 0;
      r2i.elemsize = 0;
      r2i.elempack = 0;
      r2i.allocator = (Allocator *)0x0;
      r2i.dims = 0;
      r2i.w = 0;
      r2i.h = 0;
      r2i.d = 0;
      r2i.c = 0;
      ncnn::Mat::create(&r2i,0x40,0x40,0x14,4,(Allocator *)0x0);
      r3i.cstep = 0;
      r3i.data = (void *)0x0;
      r3i.refcount._0_4_ = 0;
      r3i.refcount._4_4_ = 0;
      r3i._16_12_ = SUB1612((undefined1  [16])0x0,4);
      r3i.allocator = (Allocator *)0x0;
      r3i.dims = 0;
      r3i.w = 0;
      r3i.h = 0;
      r3i.d = 0;
      r3i.c = 0;
      ncnn::Mat::create(&r3i,0x20,0x20,0x28,4,(Allocator *)0x0);
      r4i.cstep = 0;
      r4i.data = (void *)0x0;
      r4i.refcount._0_4_ = 0;
      r4i.refcount._4_4_ = 0;
      r4i._16_12_ = SUB1612((undefined1  [16])0x0,4);
      r4i.allocator = (Allocator *)0x0;
      r4i.dims = 0;
      r4i.w = 0;
      r4i.h = 0;
      r4i.d = 0;
      r4i.c = 0;
      ncnn::Mat::create(&r4i,0x10,0x10,0x40,4,(Allocator *)0x0);
      if (0 < r1i.c * (int)r1i.cstep) {
        memset((void *)CONCAT44(r1i.data._4_4_,r1i.data._0_4_),0,
               (ulong)(uint)(r1i.c * (int)r1i.cstep) << 2);
      }
      if (0 < r2i.c * (int)r2i.cstep) {
        memset((void *)CONCAT44(r2i.data._4_4_,r2i.data._0_4_),0,
               (ulong)(uint)(r2i.c * (int)r2i.cstep) << 2);
      }
      if (0 < r3i.c * (int)r3i.cstep) {
        memset(r3i.data,0,(ulong)(uint)(r3i.c * (int)r3i.cstep) << 2);
      }
      if (0 < r4i.c * (int)r4i.cstep) {
        memset(r4i.data,0,(ulong)(uint)(r4i.c * (int)r4i.cstep) << 2);
      }
      ncnn::Net::create_extractor((Net *)&ex);
      mean_vals1[0] = 123.675;
      mean_vals1[1] = 116.28;
      mean_vals1[2] = 103.53;
      norm_vals1[0] = 0.01712475;
      norm_vals1[1] = 0.0175;
      norm_vals1[2] = 0.01742919;
      mean_vals2[0] = 0.0;
      mean_vals2[1] = 0.0;
      mean_vals2[2] = 0.0;
      norm_vals2[0] = 0.003921569;
      norm_vals2[1] = 0.003921569;
      norm_vals2[2] = 0.003921569;
      ncnn::Mat::from_pixels_resize
                (&ncnn_in2,local_248,0x10002,local_24c,local_250,0x200,0x200,(Allocator *)0x0);
      ncnn::Mat::from_pixels_resize
                (&ncnn_in1,local_248,0x10002,local_24c,local_250,0x100,0x100,(Allocator *)0x0);
      ncnn::Mat::substract_mean_normalize(&ncnn_in1,mean_vals1,norm_vals1);
      ncnn::Mat::substract_mean_normalize(&ncnn_in2,mean_vals2,norm_vals2);
      ncnn::Extractor::input(&ex,"src1",&ncnn_in1);
      ncnn::Extractor::input(&ex,"src2",&ncnn_in2);
      ncnn::Extractor::input(&ex,"r1i",&r1i);
      ncnn::Extractor::input(&ex,"r2i",&r2i);
      ncnn::Extractor::input(&ex,"r3i",&r3i);
      ncnn::Extractor::input(&ex,"r4i",&r4i);
      ncnn::Extractor::extract(&ex,"r4o",&r4i,0);
      ncnn::Extractor::extract(&ex,"r3o",&r3i,0);
      ncnn::Extractor::extract(&ex,"r2o",&r2i,0);
      ncnn::Extractor::extract(&ex,"r1o",&r1i,0);
      pha_.cstep = 0;
      pha_.data = (void *)0x0;
      pha_.refcount._0_4_ = 0;
      pha_.refcount._4_4_ = 0;
      pha_._16_12_ = SUB1612((undefined1  [16])0x0,4);
      pha_.allocator = (Allocator *)0x0;
      pha_.dims = 0;
      pha_.w = 0;
      pha_.h = 0;
      pha_.d = 0;
      pha_.c = 0;
      ncnn::Extractor::extract(&ex,"pha",&pha_,0);
      fgr_.cstep = 0;
      fgr_.data = (void *)0x0;
      fgr_.refcount._0_4_ = 0;
      fgr_.refcount._4_4_ = 0;
      fgr_._16_12_ = SUB1612((undefined1  [16])0x0,4);
      fgr_.allocator = (Allocator *)0x0;
      fgr_.dims = 0;
      fgr_.w = 0;
      fgr_.h = 0;
      fgr_.d = 0;
      fgr_.c = 0;
      ncnn::Extractor::extract(&ex,"fgr",&fgr_,0);
      cv::Mat::Mat(&cv_pha,pha_.h,pha_.w,5,pha_.data,0);
      cv::Mat::Mat(&cv_fgr,fgr_.h,fgr_.w,0x15);
      if (0 < (long)fgr_.h) {
        iVar8 = fgr_.h * fgr_.w;
        iVar9 = iVar8 * 2;
        lVar10 = 0;
        pvVar11 = fgr_.data;
        do {
          if (0 < fgr_.w) {
            puVar7 = (undefined4 *)(*local_420 * lVar10 + local_460 + 8);
            uVar12 = 0;
            do {
              *puVar7 = *(undefined4 *)((long)pvVar11 + uVar12 * 4);
              puVar7[-1] = *(undefined4 *)((long)fgr_.data + uVar12 * 4 + (long)iVar8 * 4);
              puVar7[-2] = *(undefined4 *)((long)fgr_.data + uVar12 * 4 + (long)iVar9 * 4);
              uVar12 = uVar12 + 1;
              puVar7 = puVar7 + 3;
            } while ((uint)fgr_.w != uVar12);
          }
          lVar10 = lVar10 + 1;
          iVar9 = iVar9 + fgr_.w;
          iVar8 = iVar8 + fgr_.w;
          pvVar11 = (void *)((long)pvVar11 + (long)fgr_.w * 4);
        } while (lVar10 != fgr_.h);
      }
      cv::Mat::copyTo((_OutputArray *)&cv_pha);
      cv::Mat::copyTo((_OutputArray *)&cv_fgr);
      cv::Mat::~Mat(&cv_fgr);
      cv::Mat::~Mat(&cv_pha);
      piVar3 = (int *)CONCAT44(fgr_.refcount._4_4_,fgr_.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (fgr_.allocator == (Allocator *)0x0) {
            if (fgr_.data != (void *)0x0) {
              free(fgr_.data);
            }
          }
          else {
            (*(fgr_.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar3 = (int *)CONCAT44(pha_.refcount._4_4_,pha_.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (pha_.allocator == (Allocator *)0x0) {
            if (pha_.data != (void *)0x0) {
              free(pha_.data);
            }
          }
          else {
            (*(pha_.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (ncnn_in1.refcount != (int *)0x0) {
        LOCK();
        *ncnn_in1.refcount = *ncnn_in1.refcount + -1;
        UNLOCK();
        if (*ncnn_in1.refcount == 0) {
          if (ncnn_in1.allocator == (Allocator *)0x0) {
            if (ncnn_in1.data != (void *)0x0) {
              free(ncnn_in1.data);
            }
          }
          else {
            (*(ncnn_in1.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (ncnn_in2.refcount != (int *)0x0) {
        LOCK();
        *ncnn_in2.refcount = *ncnn_in2.refcount + -1;
        UNLOCK();
        if (*ncnn_in2.refcount == 0) {
          if (ncnn_in2.allocator == (Allocator *)0x0) {
            if (ncnn_in2.data != (void *)0x0) {
              free(ncnn_in2.data);
            }
          }
          else {
            (*(ncnn_in2.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Extractor::~Extractor(&ex);
      piVar3 = (int *)CONCAT44(r4i.refcount._4_4_,r4i.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (r4i.allocator == (Allocator *)0x0) {
            if (r4i.data != (void *)0x0) {
              free(r4i.data);
            }
          }
          else {
            (*(r4i.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar3 = (int *)CONCAT44(r3i.refcount._4_4_,r3i.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (r3i.allocator == (Allocator *)0x0) {
            if (r3i.data != (void *)0x0) {
              free(r3i.data);
            }
          }
          else {
            (*(r3i.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar3 = (int *)CONCAT44(r2i.refcount._4_4_,r2i.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (r2i.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(r2i.data._4_4_,r2i.data._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(r2i.data._4_4_,r2i.data._0_4_));
            }
          }
          else {
            (*(r2i.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar3 = (int *)CONCAT44(r1i.refcount._4_4_,r1i.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (r1i.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(r1i.data._4_4_,r1i.data._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(r1i.data._4_4_,r1i.data._0_4_));
            }
          }
          else {
            (*(r1i.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Net::~Net(&net);
      cv::Mat::Mat(&cv_pha);
      _cv_fgr = 0x2010000;
      cv::Mat::convertTo((_OutputArray *)&fgr,(int)&cv_fgr,255.0,0.0);
      cv::Mat::Mat(&cv_fgr);
      net._vptr_Net._0_4_ = 0x2010000;
      net.opt.blob_allocator = (Allocator *)0x0;
      net.opt._0_8_ = &cv_fgr;
      cv::Mat::convertTo((_OutputArray *)&pha,(int)&net,255.0,0.0);
      cv::Mat::Mat((Mat *)&net);
      r1i.elemsize._0_4_ = 0;
      r1i.elemsize._4_4_ = 0;
      r1i.data._0_4_ = 0x1010000;
      r1i.refcount = (int *)&m;
      r2i.elemsize = 0;
      r2i.data._0_4_ = 0x2010000;
      r3i.data = (void *)CONCAT44((int)*local_b0,(int)((ulong)*local_b0 >> 0x20));
      r2i.refcount = (int *)&net;
      cv::resize(0,0);
      local_460._0_4_ = (int)&cv_pha;
      local_460._4_4_ = (int)((ulong)&cv_pha >> 0x20);
      if (0 < (int)local_460) {
        lVar10 = 0;
        do {
          if (0xffffffff < (long)&cv_pha) {
            lVar5 = 2;
            lVar6 = 0;
            do {
              fVar13 = (float)*(byte *)(lVar6 + *local_420 * lVar10) / 255.0;
              fVar14 = 1.0 - fVar13;
              *(char *)((long)net.opt.blob_allocator + lVar5 + -2 + (long)(net.d)->opt * lVar10) =
                   (char)(int)((float)*(byte *)(lVar5 + -2 + *local_3c0 * lVar10 + local_3f8[0]) *
                               fVar13 + fVar14 * 155.0);
              *(char *)((long)net.opt.blob_allocator + lVar5 + -1 + (long)(net.d)->opt * lVar10) =
                   (char)(int)((float)*(byte *)(lVar5 + -1 + *local_3c0 * lVar10 + local_3f8[0]) *
                               fVar13 + fVar14 * 255.0);
              *(char *)((long)&(net.opt.blob_allocator)->_vptr_Allocator +
                       lVar5 + (long)(net.d)->opt * lVar10) =
                   (char)(int)((float)*(byte *)(lVar5 + *local_3c0 * lVar10 + local_3f8[0]) * fVar13
                              + fVar14 * 120.0);
              lVar6 = lVar6 + 1;
              lVar5 = lVar5 + 3;
            } while (lVar6 < local_460._4_4_);
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < (int)local_460);
      }
      psVar1 = &r1i.elemsize;
      r1i.elemsize._0_4_ = 0x616870;
      r1i.refcount._0_4_ = 3;
      r1i.refcount._4_4_ = 0;
      r2i.elemsize = 0;
      r2i.data._0_4_ = 0x1010000;
      r2i.refcount = (int *)&cv_fgr;
      r1i.data = psVar1;
      cv::imshow((string *)&r1i,(_InputArray *)&r2i);
      if ((size_t *)r1i.data != psVar1) {
        operator_delete(r1i.data);
      }
      r1i.elemsize._0_4_ = 0x726766;
      r1i.refcount._0_4_ = 3;
      r1i.refcount._4_4_ = 0;
      r2i.elemsize = 0;
      r2i.data._0_4_ = 0x1010000;
      r2i.refcount = (int *)&cv_pha;
      r1i.data = psVar1;
      cv::imshow((string *)&r1i,(_InputArray *)&r2i);
      if ((size_t *)r1i.data != psVar1) {
        operator_delete(r1i.data);
      }
      r1i.elemsize._0_4_ = 0x706d6f63;
      r1i.refcount._0_4_ = 4;
      r1i.refcount._4_4_ = 0;
      r1i.elemsize._4_4_ = r1i.elemsize._4_4_ & 0xffffff00;
      r2i.elemsize = 0;
      r2i.data._0_4_ = 0x1010000;
      r2i.refcount = (int *)&net;
      r1i.data = psVar1;
      cv::imshow((string *)&r1i,(_InputArray *)&r2i);
      if ((size_t *)r1i.data != psVar1) {
        operator_delete(r1i.data);
      }
      iVar9 = 0;
      cv::waitKey(0);
      cv::Mat::~Mat((Mat *)&net);
      cv::Mat::~Mat(&cv_fgr);
      cv::Mat::~Mat(&cv_pha);
      cv::Mat::~Mat(&pha);
      cv::Mat::~Mat(&fgr);
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar2);
      iVar9 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    main_cold_1();
    iVar9 = -1;
  }
  return iVar9;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    cv::Mat fgr, pha;
    detect_rvm(m, pha, fgr);
    draw_objects(m, fgr, pha);

    return 0;
}